

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_equals(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  _Bool _Var1;
  int *in_RSI;
  int *in_RDI;
  _Bool areequal;
  int i_1;
  int i;
  roaring_array_t *ra2;
  roaring_array_t *ra1;
  int local_30;
  int iVar2;
  int *c1;
  _Bool local_1;
  
  if (*in_RDI == *in_RSI) {
    for (iVar2 = 0; iVar2 < *in_RDI; iVar2 = iVar2 + 1) {
      if (*(short *)(*(long *)(in_RDI + 4) + (long)iVar2 * 2) !=
          *(short *)(*(long *)(in_RSI + 4) + (long)iVar2 * 2)) {
        return false;
      }
    }
    c1 = in_RSI;
    for (local_30 = 0; local_30 < *in_RDI; local_30 = local_30 + 1) {
      _Var1 = container_equals(c1,(uint8_t)((ulong)in_RDI >> 0x38),in_RSI,
                               (uint8_t)((uint)iVar2 >> 0x18));
      if (!_Var1) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool roaring_bitmap_equals(const roaring_bitmap_t *r1,
                           const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    if (ra1->size != ra2->size) {
        return false;
    }
    for (int i = 0; i < ra1->size; ++i) {
        if (ra1->keys[i] != ra2->keys[i]) {
            return false;
        }
    }
    for (int i = 0; i < ra1->size; ++i) {
        bool areequal = container_equals(ra1->containers[i], ra1->typecodes[i],
                                         ra2->containers[i], ra2->typecodes[i]);
        if (!areequal) {
            return false;
        }
    }
    return true;
}